

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

FuncType * __thiscall wabt::Module::GetFuncType(Module *this,Var *var)

{
  pointer ppTVar1;
  FuncType *pFVar2;
  Index IVar3;
  FuncType *pFVar4;
  
  IVar3 = BindingHash::FindIndex(&this->type_bindings,var);
  ppTVar1 = (this->types).super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)IVar3 <
      (ulong)((long)(this->types).
                    super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3)) {
    pFVar2 = (FuncType *)ppTVar1[IVar3];
    pFVar4 = (FuncType *)0x0;
    if ((pFVar2->super_TypeEntry).kind_ == Func) {
      pFVar4 = pFVar2;
    }
  }
  else {
    pFVar4 = (FuncType *)0x0;
  }
  return pFVar4;
}

Assistant:

FuncType* Module::GetFuncType(const Var& var) {
  Index index = type_bindings.FindIndex(var);
  if (index >= types.size()) {
    return nullptr;
  }
  return dyn_cast<FuncType>(types[index]);
}